

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::DataDictionaryMessageTest_TestToString_Test::TestBody
          (DataDictionaryMessageTest_TestToString_Test *this)

{
  char *message;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  bidfx_public_api::price::pixie::DataDictionaryMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[697],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"DataDictionary(update=false, fields=[\\n\" \"  fieldDef(FID=0, name=\\\"Bid\\\", type=DOUBLE, encoding=VARINT, scale=6)\\n\" \"  fieldDef(FID=1, name=\\\"Ask\\\", type=DOUBLE, encoding=VARINT, scale=6)\\n\" \"  fieldDef(FID=2, name=\\\"BidSize\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=3, name=\\\"AskSize\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=4, name=\\\"BidTime\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=5, name=\\\"AskTime\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=6, name=\\\"OrderQuantity\\\", type=DOUBLE, encoding=VARINT, scale=2)\\n\" \"  fieldDef(FID=9, name=\\\"NetChange\\\", type=DOUBLE, encoding=ZIGZAG, scale=4)\\n\" \"  fieldDef(FID=10, name=\\\"PercentChange\\\", type=DOUBLE, encoding=ZIGZAG, scale=2)\\n\" \"])\""
             ,"data_dict_message->ToString()",
             (char (*) [697])
             "DataDictionary(update=false, fields=[\n  fieldDef(FID=0, name=\"Bid\", type=DOUBLE, encoding=VARINT, scale=6)\n  fieldDef(FID=1, name=\"Ask\", type=DOUBLE, encoding=VARINT, scale=6)\n  fieldDef(FID=2, name=\"BidSize\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=3, name=\"AskSize\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=4, name=\"BidTime\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=5, name=\"AskTime\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=6, name=\"OrderQuantity\", type=DOUBLE, encoding=VARINT, scale=2)\n  fieldDef(FID=9, name=\"NetChange\", type=DOUBLE, encoding=ZIGZAG, scale=4)\n  fieldDef(FID=10, name=\"PercentChange\", type=DOUBLE, encoding=ZIGZAG, scale=2)\n])"
             ,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/data_dictionary_message_test.cpp"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(DataDictionaryMessageTest, TestToString)
{
    ASSERT_EQ("DataDictionary(update=false, fields=[\n"
                 "  fieldDef(FID=0, name=\"Bid\", type=DOUBLE, encoding=VARINT, scale=6)\n"
                 "  fieldDef(FID=1, name=\"Ask\", type=DOUBLE, encoding=VARINT, scale=6)\n"
                 "  fieldDef(FID=2, name=\"BidSize\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=3, name=\"AskSize\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=4, name=\"BidTime\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=5, name=\"AskTime\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=6, name=\"OrderQuantity\", type=DOUBLE, encoding=VARINT, scale=2)\n"
                 "  fieldDef(FID=9, name=\"NetChange\", type=DOUBLE, encoding=ZIGZAG, scale=4)\n"
                 "  fieldDef(FID=10, name=\"PercentChange\", type=DOUBLE, encoding=ZIGZAG, scale=2)\n"
                 "])", data_dict_message->ToString());
}